

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression *
build_ir_logical_and_or(Context_conflict *ctx,MOJOSHADER_astExpressionBinary *ast,int left_testval)

{
  int iVar1;
  int iVar2;
  MOJOSHADER_astExpression *_ast;
  MOJOSHADER_irExpression *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  Context_conflict *pCVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *pMVar11;
  MOJOSHADER_irStatement *pMVar12;
  MOJOSHADER_irStatement *next;
  int writemask;
  int iVar13;
  MOJOSHADER_irStatement *local_48;
  
  _ast = ast->left;
  if (_ast->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1313,
                  "MOJOSHADER_irExpression *build_ir_logical_and_or(Context *, const MOJOSHADER_astExpressionBinary *, const int)"
                 );
  }
  if (ast->right->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->right->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1314,
                  "MOJOSHADER_irExpression *build_ir_logical_and_or(Context *, const MOJOSHADER_astExpressionBinary *, const int)"
                 );
  }
  iVar1 = ctx->ir_label_count;
  iVar2 = ctx->ir_temp_count;
  ctx->ir_label_count = iVar1 + 4;
  ctx->ir_temp_count = iVar2 + 1;
  pMVar3 = (MOJOSHADER_irExpression *)build_ir(ctx,_ast);
  if (pMVar3 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar3->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) goto LAB_00149360;
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar3->ir).type) goto LAB_0014937f;
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar4 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    (pMVar4->temp).index = left_testval;
  }
  iVar13 = iVar1 + 1;
  local_48 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
  if (local_48 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    local_48 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (local_48->ir).type = MOJOSHADER_IR_CJUMP;
    (local_48->ir).filename = ctx->sourcefile;
    (local_48->ir).line = ctx->sourceline;
    (local_48->jump).label = 0;
    (local_48->move).src = pMVar3;
    (local_48->cjump).right = pMVar4;
    (local_48->cjump).iftrue = iVar1 + 2;
    (local_48->cjump).iffalse = iVar13;
  }
  pMVar5 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar5 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar5 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar5->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar5->ir).filename = ctx->sourcefile;
    (pMVar5->ir).line = ctx->sourceline;
    (pMVar5->jump).label = iVar1 + 2;
  }
  pMVar3 = (MOJOSHADER_irExpression *)build_ir(ctx,ast->right);
  if (pMVar3 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar3->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
LAB_00149360:
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar3->ir).type) {
LAB_0014937f:
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->out_of_memory = 1;
    pMVar4 = (MOJOSHADER_irExpression *)0x0;
    pCVar6 = ctx;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    pCVar6 = (Context_conflict *)&(pMVar4->temp).index;
  }
  pCVar6->isfail = 1;
  pMVar7 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
  if (pMVar7 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar7 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar7->ir).type = MOJOSHADER_IR_CJUMP;
    (pMVar7->ir).filename = ctx->sourcefile;
    (pMVar7->ir).line = ctx->sourceline;
    (pMVar7->jump).label = 0;
    (pMVar7->move).src = pMVar3;
    (pMVar7->cjump).right = pMVar4;
    (pMVar7->cjump).iftrue = iVar1;
    (pMVar7->cjump).iffalse = iVar13;
  }
  pMVar8 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar8 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar8 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar8->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar8->ir).filename = ctx->sourcefile;
    (pMVar8->ir).line = ctx->sourceline;
    (pMVar8->jump).label = iVar1;
  }
  pMVar3 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar3 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar3 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar3->ir).type = MOJOSHADER_IR_TEMP;
    (pMVar3->ir).filename = ctx->sourcefile;
    (pMVar3->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar3 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar3 + 0x1c) = 1;
    (pMVar3->temp).index = iVar2;
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->out_of_memory = 1;
    pMVar4 = (MOJOSHADER_irExpression *)0x0;
    pCVar6 = ctx;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    pCVar6 = (Context_conflict *)((long)pMVar4 + 0x20);
  }
  pCVar6->isfail = 1;
  pMVar9 = new_ir_move(ctx,pMVar3,pMVar4,(int)pCVar6);
  writemask = (int)pCVar6;
  pMVar10 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar10 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar10 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar10->ir).type = MOJOSHADER_IR_JUMP;
    (pMVar10->ir).filename = ctx->sourcefile;
    (pMVar10->ir).line = ctx->sourceline;
    (pMVar10->jump).label = iVar1 + 3;
  }
  pMVar11 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar11 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar11 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar11->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar11->ir).filename = ctx->sourcefile;
    (pMVar11->ir).line = ctx->sourceline;
    (pMVar11->jump).label = iVar13;
  }
  pMVar3 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar3 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar3 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar3->ir).type = MOJOSHADER_IR_TEMP;
    (pMVar3->ir).filename = ctx->sourcefile;
    (pMVar3->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar3 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar3 + 0x1c) = 1;
    (pMVar3->temp).index = iVar2;
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar4 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    writemask = 1;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    (pMVar4->temp).index = 0;
  }
  pMVar12 = new_ir_move(ctx,pMVar3,pMVar4,writemask);
  next = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (next == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    next = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (next->ir).type = MOJOSHADER_IR_LABEL;
    (next->ir).filename = ctx->sourcefile;
    (next->ir).line = ctx->sourceline;
    (next->jump).label = iVar1 + 3;
  }
  pMVar12 = new_ir_seq(ctx,pMVar12,next);
  pMVar11 = new_ir_seq(ctx,pMVar11,pMVar12);
  pMVar10 = new_ir_seq(ctx,pMVar10,pMVar11);
  pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
  pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
  pMVar7 = new_ir_seq(ctx,pMVar7,pMVar8);
  pMVar5 = new_ir_seq(ctx,pMVar5,pMVar7);
  pMVar5 = new_ir_seq(ctx,local_48,pMVar5);
  pMVar3 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar3 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar3 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar3->ir).type = MOJOSHADER_IR_TEMP;
    (pMVar3->ir).filename = ctx->sourcefile;
    (pMVar3->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar3 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar3 + 0x1c) = 1;
    (pMVar3->temp).index = iVar2;
  }
  pMVar3 = new_ir_eseq(ctx,pMVar5,pMVar3);
  return pMVar3;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_logical_and_or(Context *ctx,
                                    const MOJOSHADER_astExpressionBinary *ast,
                                    const int left_testval)
{
    /* The gist...
            cjump left == left_testval, maybe, f
        maybe:
            cjump right == true, t, f
        t:
            move tmp, 1
            jump join
        f:
            move tmp, 0
        join:
    */

    assert(ast->left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
    assert(ast->right->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int maybe = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);
    const int tmp = generate_ir_temp(ctx);

    return new_ir_eseq(ctx,
                new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->left), new_ir_constbool(ctx, left_testval), maybe, f),
                new_ir_seq(ctx, new_ir_label(ctx, maybe),
                new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->right), new_ir_constbool(ctx, 1), t, f),
                new_ir_seq(ctx, new_ir_label(ctx, t),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1), new_ir_constbool(ctx, 1), -1),
                new_ir_seq(ctx, new_ir_jump(ctx, join),
                new_ir_seq(ctx, new_ir_label(ctx, f),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1), new_ir_constbool(ctx, 0), -1),
                                new_ir_label(ctx, join))))))))),
                    new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1));
}